

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  Enum EVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  Result RVar5;
  Result RVar6;
  Result RVar7;
  bool bVar8;
  uint uVar9;
  Type TVar10;
  Type type2;
  Type type1;
  Type actual;
  Type local_3c;
  Type local_38;
  Type local_34;
  
  local_38.enum_ = Any;
  local_3c.enum_ = Any;
  local_34.enum_ = Any;
  RVar5 = PeekType(this,0,&local_34);
  uVar9 = local_34.enum_ + I32;
  RVar6 = PeekType(this,1,&local_38);
  RVar7 = PeekType(this,2,&local_3c);
  bVar4 = (RVar7.enum_ == Error || (RVar6.enum_ == Error || RVar5.enum_ == Error)) ||
          uVar9 < 0xfffffffe;
  pTVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 == pTVar3) {
    bVar8 = true;
    TVar10.enum_ = Any;
    if ((8 < (uint)(local_38.enum_ + ~(Func|I32U))) ||
       ((0x181U >> (local_38.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
      if ((8 < (uint)(local_3c.enum_ + ~(Func|I32U))) ||
         ((0x181U >> (local_3c.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
        bVar8 = bVar4 || local_38.enum_ != local_3c.enum_ &&
                         (local_38.enum_ != Any && local_3c.enum_ != Any);
        TVar10.enum_ = local_38.enum_;
      }
    }
  }
  else {
    if ((long)pTVar3 - (long)pTVar2 != 4) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/type-checker.cc"
                    ,0x2ed,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    EVar1 = pTVar2->enum_;
    bVar8 = local_3c.enum_ != EVar1 && (local_3c.enum_ != Any && EVar1 != Any) ||
            (bVar4 || local_38.enum_ != EVar1 && (local_38.enum_ != Any && EVar1 != Any));
    TVar10.enum_ = Any;
  }
  RVar5.enum_._1_3_ = 0;
  RVar5.enum_._0_1_ = bVar8;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar5,"select",TVar10,TVar10,I32);
  RVar5 = DropTypes(this,3);
  PushType(this,TVar10);
  return (Result)(uint)(byte)(bVar8 | RVar5.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}